

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O2

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::FastGeneralizationsIterator::
findNextLeaf(FastGeneralizationsIterator *this)

{
  GenMatcher *this_00;
  long *plVar1;
  uint **ppuVar2;
  void **ppvVar3;
  void **ppvVar4;
  bool separate;
  int iVar5;
  NodeAlgorithm *pNVar6;
  uint *puVar7;
  Node *pNVar8;
  long *elem;
  uint specVar;
  bool bVar9;
  Node *curr;
  Node *local_40;
  VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*> local_38;
  
  if (this->_inLeaf == true) {
    if ((this->_alternatives)._cursor != (this->_alternatives)._stack) {
      SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::backtrack(&this->_subst);
      this->_inLeaf = false;
      local_40 = (Node *)0x0;
      separate = false;
LAB_002ac8dc:
      this_00 = &this->_subst;
LAB_002ac8ec:
      bVar9 = local_40 == (Node *)0x0;
      do {
        specVar = 0;
        if (!bVar9) {
          puVar7 = (this->_specVarNumbers)._cursor + -1;
          if (separate == false) {
            (this->_specVarNumbers)._cursor = puVar7;
          }
          specVar = *puVar7;
        }
        do {
          while( true ) {
            if (local_40 != (Node *)0x0) goto LAB_002aca28;
            ppvVar3 = (this->_alternatives)._stack;
            ppvVar4 = (this->_alternatives)._cursor;
            if (ppvVar4 == ppvVar3) {
              return false;
            }
            (this->_alternatives)._cursor = ppvVar4 + -1;
            elem = (long *)ppvVar4[-1];
            pNVar6 = (this->_nodeTypes)._cursor + -1;
            if (elem != (long *)0x0) break;
            (this->_nodeTypes)._cursor = pNVar6;
            ppuVar2 = &(this->_specVarNumbers)._cursor;
            *ppuVar2 = *ppuVar2 + -1;
            if (ppvVar4 + -1 != ppvVar3) {
              SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::backtrack
                        (this_00);
            }
          }
          if (*pNVar6 == UNSORTED_LIST) {
            while ((local_40 = (Node *)*elem, local_40 != (Node *)0x0 &&
                   (((local_40->_term)._content & 1) == 0))) {
              elem = elem + 1;
            }
            do {
              plVar1 = elem + 1;
              if (*plVar1 == 0) goto LAB_002ac9d6;
              elem = elem + 1;
            } while ((*(byte *)(*plVar1 + 8) & 1) == 0);
LAB_002ac9f3:
            Lib::Stack<void_*>::push(&this->_alternatives,elem);
            separate = true;
LAB_002ac9fe:
            puVar7 = (this->_specVarNumbers)._cursor + -1;
            pNVar8 = local_40;
          }
          else {
            pNVar8 = (Node *)*elem;
            if (((pNVar8->_term)._content & 1) != 0) {
              elem = (long *)elem[1];
              local_40 = pNVar8;
              if ((elem == (long *)0x0) || ((*(byte *)(*elem + 8) & 1) == 0)) {
LAB_002ac9d6:
                separate = false;
                pNVar8 = local_40;
                goto LAB_002ac9d8;
              }
              goto LAB_002ac9f3;
            }
            if (separate != false) goto LAB_002ac9fe;
            pNVar8 = (Node *)0x0;
LAB_002ac9d8:
            (this->_nodeTypes)._cursor = pNVar6;
            puVar7 = (this->_specVarNumbers)._cursor + -1;
            (this->_specVarNumbers)._cursor = puVar7;
          }
          specVar = *puVar7;
        } while (pNVar8 == (Node *)0x0);
        if (local_40 == (Node *)0x0) {
          return false;
        }
LAB_002aca28:
        bVar9 = SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::matchNext
                          (this_00,specVar,(TermList)(local_40->_term)._content,separate);
        if (!bVar9) {
          local_40 = (Node *)0x0;
          if (separate == false) {
LAB_002acadc:
            if ((this->_alternatives)._cursor != (this->_alternatives)._stack) {
              SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::backtrack
                        (this_00);
            }
          }
          goto LAB_002ac8ec;
        }
        do {
          iVar5 = (*local_40->_vptr_Node[2])();
          if ((((char)iVar5 != '\0') || (iVar5 = (*local_40->_vptr_Node[5])(), iVar5 != 1)) ||
             (*(int *)((long)&local_40[1]._vptr_Node + 4) != 1)) {
            iVar5 = (*local_40->_vptr_Node[2])();
            if ((char)iVar5 != '\0') {
              (*local_40->_vptr_Node[8])(&local_38);
              Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>::operator=
                        (&this->_ldIterator,&local_38);
              Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>::~VirtualIterator
                        (&local_38);
              this->_inLeaf = true;
              return true;
            }
            separate = enterNode(this,&local_40);
            if (local_40 != (Node *)0x0) goto LAB_002ac8ec;
            goto LAB_002acadc;
          }
          pNVar8 = local_40 + 1;
          local_40 = (Node *)local_40[1]._term._content;
          bVar9 = SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::matchNext
                            (this_00,*(uint *)&pNVar8->_vptr_Node,
                             (TermList)(local_40->_term)._content,false);
        } while (bVar9);
        if ((separate != false) || ((this->_alternatives)._cursor != (this->_alternatives)._stack))
        {
          SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::backtrack(this_00);
        }
        local_40 = (Node *)0x0;
        bVar9 = true;
      } while( true );
    }
  }
  else {
    local_40 = this->_root;
    if (local_40 != (Node *)0x0) {
      this->_root = (Node *)0x0;
      separate = enterNode(this,&local_40);
      goto LAB_002ac8dc;
    }
  }
  return false;
}

Assistant:

bool SubstitutionTree<LeafData_>::FastGeneralizationsIterator::findNextLeaf()
{
  Node* curr;
  bool sibilingsRemain = false;
  if(_inLeaf) {
    if(_alternatives.isEmpty()) {
      return false;
    }
    _subst.backtrack();
    _inLeaf=false;
    curr=0;
  } else {
    if(!_root) {
      //If we aren't in a leaf and the findNextLeaf method has already been called,
      //it means that we're out of leafs.
      return false;
    }
    curr=_root;
    _root=0;
    sibilingsRemain=enterNode(curr);
  }
  for(;;) {
main_loop_start:
    unsigned currSpecVar = 0;

    if(curr) {
      if(sibilingsRemain) {
	ASS(_nodeTypes.top()!=UNSORTED_LIST || *static_cast<Node**>(_alternatives.top()));
	currSpecVar=_specVarNumbers.top();
      } else {
	currSpecVar=_specVarNumbers.pop();
      }
    }
    //let's find a node we haven't been to...
    while(curr==0 && _alternatives.isNonEmpty()) {
      void* currAlt=_alternatives.pop();
      if(!currAlt) {
	//there's no alternative at this level, we have to backtrack
	_nodeTypes.pop();
	_specVarNumbers.pop();
	if(_alternatives.isNonEmpty()) {
	  _subst.backtrack();
	}
	continue;
      }

      NodeAlgorithm parentType=_nodeTypes.top();

      //proper term nodes that we want to enter don't appear
      //on _alternatives stack (as we always enter them first)
      if(parentType==UNSORTED_LIST) {
	Node** alts=static_cast<Node**>(currAlt);
	while(*alts && !(*alts)->term().isVar()) {
	  alts++;
	}
	curr=*(alts++);
	while(*alts && !(*alts)->term().isVar()) {
	  alts++;
	}
	if(*alts) {
	  _alternatives.push(alts);
	  sibilingsRemain=true;
	} else {
	  sibilingsRemain=false;
	}
      } else {
	ASS_EQ(parentType,SKIP_LIST)
	auto alts = static_cast<typename SListIntermediateNode::NodeSkipList::Node *>(currAlt);
	if(alts->head()->term().isVar()) {
	  curr=alts->head();
	  if(alts->tail() && alts->tail()->head()->term().isVar()) {
	    _alternatives.push(alts->tail());
	    sibilingsRemain=true;
	  } else {
	    sibilingsRemain=false;
	  }
	}
      }

      if(sibilingsRemain) {
	currSpecVar=_specVarNumbers.top();
      } else {
	_nodeTypes.pop();
	currSpecVar=_specVarNumbers.pop();
      }
      if(curr) {
	break;
      }
    }
    if(!curr) {
      //there are no other alternatives
      return false;
    }
    if(!_subst.matchNext(currSpecVar, curr->term(), sibilingsRemain)) {	//[1]
      //match unsuccessful, try next alternative
      curr=0;
      if(!sibilingsRemain && _alternatives.isNonEmpty()) {
        _subst.backtrack();
      }
      continue;
    }
    while(!curr->isLeaf() && curr->algorithm()==UNSORTED_LIST && static_cast<UArrIntermediateNode*>(curr)->_size==1) {
      //a node with only one child, we don't need to bother with backtracking here.
      unsigned specVar=static_cast<UArrIntermediateNode*>(curr)->childVar;
      curr=static_cast<UArrIntermediateNode*>(curr)->_nodes[0];
      ASS(curr);
      if(!_subst.matchNext(specVar, curr->term(), false)) {
	//matching failed, let's go back to the node, that had multiple children
	//_subst->backtrack();
	if(sibilingsRemain || _alternatives.isNonEmpty()) {
	  //this backtrack can happen for two different reasons and have two different meanings:
	  //either matching at [1] was separated from the previous one and we're backtracking it,
	  //or it was not, which means it had no sibilings and we're backtracking from its parent.
	  _subst.backtrack();
	}
        curr=0;
        goto main_loop_start;
      }
    }
    if(curr->isLeaf()) {
      //we've found a leaf
      _ldIterator=static_cast<Leaf*>(curr)->allChildren();
      _inLeaf=true;
      return true;
    }

    //let's go to the first child
    sibilingsRemain=enterNode(curr);
    if(curr==0 && _alternatives.isNonEmpty()) {
      _subst.backtrack();
    }
  }
}